

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.h
# Opt level: O0

void __thiscall cnn::FastLSTMBuilder::~FastLSTMBuilder(FastLSTMBuilder *this)

{
  FastLSTMBuilder *in_RDI;
  
  ~FastLSTMBuilder(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

FastLSTMBuilder() = default;